

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_async_dir(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_fs_t *__s1;
  char *pcVar2;
  char *pcVar3;
  uv_fs_t *puVar4;
  char *unaff_R12;
  uv_fs_t *unaff_R14;
  uv_loop_t **unaff_R15;
  uv_dirent_t dent_00;
  uv_dirent_t dent_01;
  uv_dirent_t dent;
  uv_loop_t *puStack_78;
  uint uStack_70;
  char *pcStack_68;
  char *pcStack_60;
  uv_fs_t *puStack_50;
  code *pcStack_48;
  code *pcStack_40;
  uv_loop_t *local_38;
  uint local_30;
  
  pcStack_40 = (code *)0x15c200;
  unlink("test_dir/file1");
  pcStack_40 = (code *)0x15c20c;
  unlink("test_dir/file2");
  pcVar2 = "test_dir";
  pcStack_40 = (code *)0x15c21b;
  rmdir("test_dir");
  pcStack_40 = (code *)0x15c220;
  __s1 = (uv_fs_t *)uv_default_loop();
  pcStack_40 = (code *)0x15c245;
  loop = (uv_loop_t *)__s1;
  iVar1 = uv_fs_mkdir(__s1,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar1 == 0) {
    pcStack_40 = (code *)0x15c25b;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_0015c668;
    __s1 = (uv_fs_t *)0x0;
    pcStack_40 = (code *)0x15c28b;
    iVar1 = uv_fs_open(0,&open_req1,"test_dir/file1",0x41,0x180,0);
    if (iVar1 < 0) goto LAB_0015c66d;
    pcStack_40 = (code *)0x15c29f;
    uv_fs_req_cleanup();
    __s1 = (uv_fs_t *)0x0;
    pcStack_40 = (code *)0x15c2b5;
    iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
    if (iVar1 != 0) goto LAB_0015c672;
    pcStack_40 = (code *)0x15c2c9;
    uv_fs_req_cleanup();
    __s1 = (uv_fs_t *)0x0;
    pcStack_40 = (code *)0x15c2ec;
    iVar1 = uv_fs_open(0,&open_req1,"test_dir/file2",0x41,0x180,0);
    if (iVar1 < 0) goto LAB_0015c677;
    pcStack_40 = (code *)0x15c300;
    uv_fs_req_cleanup();
    __s1 = (uv_fs_t *)0x0;
    pcStack_40 = (code *)0x15c316;
    iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
    if (iVar1 != 0) goto LAB_0015c67c;
    pcStack_40 = (code *)0x15c32a;
    uv_fs_req_cleanup(&close_req);
    pcStack_40 = (code *)0x15c34d;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_scandir(loop,&scandir_req,"test_dir",0,scandir_cb);
    if (iVar1 != 0) goto LAB_0015c681;
    pcStack_40 = (code *)0x15c363;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (scandir_cb_count != 1) goto LAB_0015c686;
    __s1 = (uv_fs_t *)0x0;
    pcStack_40 = (code *)0x15c38a;
    iVar1 = uv_fs_scandir(0,&scandir_req,"test_dir",0,0);
    if (iVar1 != 2) goto LAB_0015c68b;
    if (scandir_req.result != 2) goto LAB_0015c690;
    if (scandir_req.ptr == (void *)0x0) goto LAB_0015c695;
    pcStack_40 = (code *)0x15c3be;
    iVar1 = uv_fs_scandir_next(&scandir_req,&local_38);
    if (iVar1 != -0xfff) {
      pcVar2 = "file1";
      unaff_R14 = &scandir_req;
      unaff_R12 = "file2";
      do {
        __s1 = (uv_fs_t *)local_38;
        pcVar3 = "file1";
        pcStack_40 = (code *)0x15c3ec;
        iVar1 = strcmp((char *)local_38,"file1");
        if (iVar1 != 0) {
          pcVar3 = "file2";
          pcStack_40 = (code *)0x15c3fb;
          iVar1 = strcmp((char *)__s1,"file2");
          if (iVar1 != 0) {
            pcStack_40 = (code *)0x15c663;
            run_test_fs_async_dir_cold_11();
            unaff_R15 = &local_38;
            goto LAB_0015c663;
          }
        }
        dent_00.name = (char *)(ulong)local_30;
        pcStack_40 = (code *)0x15c40c;
        dent_00._8_8_ = pcVar3;
        assert_is_file_type(dent_00);
        pcStack_40 = (code *)0x15c417;
        iVar1 = uv_fs_scandir_next(&scandir_req,&local_38);
        unaff_R15 = &local_38;
      } while (iVar1 != -0xfff);
    }
    __s1 = &scandir_req;
    pcStack_40 = (code *)0x15c42a;
    uv_fs_req_cleanup();
    if (scandir_req.ptr != (void *)0x0) goto LAB_0015c69a;
    pcStack_40 = (code *)0x15c459;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_stat(loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_0015c69f;
    pcStack_40 = (code *)0x15c46f;
    uv_run(loop,0);
    pcStack_40 = (code *)0x15c490;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_stat(loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_0015c6a4;
    pcStack_40 = (code *)0x15c4a6;
    uv_run(loop,0);
    pcStack_40 = (code *)0x15c4c7;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_lstat(loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_0015c6a9;
    pcStack_40 = (code *)0x15c4dd;
    uv_run(loop,0);
    pcStack_40 = (code *)0x15c4fe;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_lstat(loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_0015c6ae;
    pcStack_40 = (code *)0x15c514;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (stat_cb_count != 4) goto LAB_0015c6b3;
    pcStack_40 = (code *)0x15c542;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_unlink(loop,&unlink_req,"test_dir/file1",unlink_cb);
    if (iVar1 != 0) goto LAB_0015c6b8;
    pcStack_40 = (code *)0x15c558;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (unlink_cb_count != 1) goto LAB_0015c6bd;
    pcStack_40 = (code *)0x15c586;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_unlink(loop,&unlink_req,"test_dir/file2",unlink_cb);
    if (iVar1 != 0) goto LAB_0015c6c2;
    pcStack_40 = (code *)0x15c59c;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (unlink_cb_count != 2) goto LAB_0015c6c7;
    pcStack_40 = (code *)0x15c5ca;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_rmdir(loop,&rmdir_req,"test_dir",rmdir_cb);
    if (iVar1 != 0) goto LAB_0015c6cc;
    pcStack_40 = (code *)0x15c5e0;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (rmdir_cb_count != 1) goto LAB_0015c6d1;
    pcStack_40 = (code *)0x15c5f9;
    unlink("test_dir/file1");
    pcStack_40 = (code *)0x15c605;
    unlink("test_dir/file2");
    pcStack_40 = (code *)0x15c611;
    rmdir("test_dir");
    pcStack_40 = (code *)0x15c616;
    pcVar2 = (char *)uv_default_loop();
    pcStack_40 = (code *)0x15c62a;
    uv_walk(pcVar2,close_walk_cb,0);
    pcStack_40 = (code *)0x15c634;
    uv_run(pcVar2,0);
    pcStack_40 = (code *)0x15c639;
    __s1 = (uv_fs_t *)uv_default_loop();
    pcStack_40 = (code *)0x15c641;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      pcStack_40 = (code *)0x15c64e;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
LAB_0015c663:
    pcStack_40 = (code *)0x15c668;
    run_test_fs_async_dir_cold_1();
LAB_0015c668:
    pcStack_40 = (code *)0x15c66d;
    run_test_fs_async_dir_cold_2();
LAB_0015c66d:
    pcStack_40 = (code *)0x15c672;
    run_test_fs_async_dir_cold_3();
LAB_0015c672:
    pcStack_40 = (code *)0x15c677;
    run_test_fs_async_dir_cold_4();
LAB_0015c677:
    pcStack_40 = (code *)0x15c67c;
    run_test_fs_async_dir_cold_5();
LAB_0015c67c:
    pcStack_40 = (code *)0x15c681;
    run_test_fs_async_dir_cold_6();
LAB_0015c681:
    pcStack_40 = (code *)0x15c686;
    run_test_fs_async_dir_cold_7();
LAB_0015c686:
    pcStack_40 = (code *)0x15c68b;
    run_test_fs_async_dir_cold_8();
LAB_0015c68b:
    pcStack_40 = (code *)0x15c690;
    run_test_fs_async_dir_cold_9();
LAB_0015c690:
    pcStack_40 = (code *)0x15c695;
    run_test_fs_async_dir_cold_10();
LAB_0015c695:
    pcStack_40 = (code *)0x15c69a;
    run_test_fs_async_dir_cold_25();
LAB_0015c69a:
    pcStack_40 = (code *)0x15c69f;
    run_test_fs_async_dir_cold_12();
LAB_0015c69f:
    pcStack_40 = (code *)0x15c6a4;
    run_test_fs_async_dir_cold_13();
LAB_0015c6a4:
    pcStack_40 = (code *)0x15c6a9;
    run_test_fs_async_dir_cold_14();
LAB_0015c6a9:
    pcStack_40 = (code *)0x15c6ae;
    run_test_fs_async_dir_cold_15();
LAB_0015c6ae:
    pcStack_40 = (code *)0x15c6b3;
    run_test_fs_async_dir_cold_16();
LAB_0015c6b3:
    pcStack_40 = (code *)0x15c6b8;
    run_test_fs_async_dir_cold_17();
LAB_0015c6b8:
    pcStack_40 = (code *)0x15c6bd;
    run_test_fs_async_dir_cold_18();
LAB_0015c6bd:
    pcStack_40 = (code *)0x15c6c2;
    run_test_fs_async_dir_cold_19();
LAB_0015c6c2:
    pcStack_40 = (code *)0x15c6c7;
    run_test_fs_async_dir_cold_20();
LAB_0015c6c7:
    pcStack_40 = (code *)0x15c6cc;
    run_test_fs_async_dir_cold_21();
LAB_0015c6cc:
    pcStack_40 = (code *)0x15c6d1;
    run_test_fs_async_dir_cold_22();
LAB_0015c6d1:
    pcStack_40 = (code *)0x15c6d6;
    run_test_fs_async_dir_cold_23();
  }
  pcStack_40 = mkdir_cb;
  run_test_fs_async_dir_cold_24();
  if (__s1 == &mkdir_req) {
    if (mkdir_req.fs_type != UV_FS_MKDIR) goto LAB_0015c735;
    if (mkdir_req.result != 0) goto LAB_0015c73a;
    mkdir_cb_count = mkdir_cb_count + 1;
    if (mkdir_req.path == (char *)0x0) goto LAB_0015c73f;
    if (mkdir_req.path[8] == '\0' && *(long *)mkdir_req.path == 0x7269645f74736574) {
      iVar1 = uv_fs_req_cleanup(&mkdir_req);
      return iVar1;
    }
  }
  else {
    pcStack_48 = (code *)0x15c735;
    mkdir_cb_cold_1();
LAB_0015c735:
    pcStack_48 = (code *)0x15c73a;
    mkdir_cb_cold_2();
LAB_0015c73a:
    pcStack_48 = (code *)0x15c73f;
    mkdir_cb_cold_3();
LAB_0015c73f:
    pcStack_48 = (code *)0x15c744;
    mkdir_cb_cold_5();
  }
  pcStack_48 = scandir_cb;
  mkdir_cb_cold_4();
  pcStack_68 = pcVar2;
  pcStack_60 = unaff_R12;
  puStack_50 = unaff_R14;
  pcStack_48 = (code *)unaff_R15;
  if (__s1 == &scandir_req) {
    puVar4 = __s1;
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_0015c850;
    if (scandir_req.result != 2) goto LAB_0015c855;
    if (scandir_req.ptr == (void *)0x0) goto LAB_0015c85a;
    puVar4 = &scandir_req;
    iVar1 = uv_fs_scandir_next(&scandir_req,&puStack_78);
    __s1 = (uv_fs_t *)puStack_78;
    while (iVar1 != -0xfff) {
      pcVar2 = "file1";
      puStack_78 = (uv_loop_t *)__s1;
      iVar1 = strcmp((char *)__s1,"file1");
      if (iVar1 != 0) {
        pcVar2 = "file2";
        iVar1 = strcmp((char *)__s1,"file2");
        if (iVar1 != 0) {
          scandir_cb_cold_4();
          goto LAB_0015c84b;
        }
      }
      dent_01.name = (char *)(ulong)uStack_70;
      dent_01._8_8_ = pcVar2;
      assert_is_file_type(dent_01);
      puVar4 = &scandir_req;
      iVar1 = uv_fs_scandir_next(&scandir_req,&puStack_78);
      __s1 = (uv_fs_t *)puStack_78;
    }
    scandir_cb_count = scandir_cb_count + 1;
    if ((long *)scandir_req.path == (long *)0x0) goto LAB_0015c85f;
    if ((char)*(long *)((long)scandir_req.path + 8) != '\0' ||
        *(long *)scandir_req.path != 0x7269645f74736574) goto LAB_0015c864;
    puVar4 = &scandir_req;
    iVar1 = uv_fs_req_cleanup();
    if (scandir_req.ptr == (void *)0x0) {
      return iVar1;
    }
  }
  else {
LAB_0015c84b:
    scandir_cb_cold_1();
    puVar4 = __s1;
LAB_0015c850:
    scandir_cb_cold_2();
LAB_0015c855:
    scandir_cb_cold_3();
LAB_0015c85a:
    scandir_cb_cold_8();
LAB_0015c85f:
    scandir_cb_cold_7();
LAB_0015c864:
    scandir_cb_cold_5();
  }
  scandir_cb_cold_6();
  if ((uint)puVar4 < 2) {
    return extraout_EAX;
  }
  assert_is_file_type_cold_1();
  if (puVar4 == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_0015c8cc;
    if (stat_req.result != 0) goto LAB_0015c8d1;
    if (stat_req.ptr == (void *)0x0) goto LAB_0015c8d6;
    stat_cb_count = stat_cb_count + 1;
    puVar4 = &stat_req;
    uv_fs_req_cleanup();
    if (stat_req.ptr == (void *)0x0) {
      return extraout_EAX_00;
    }
  }
  else {
    stat_cb_cold_1();
LAB_0015c8cc:
    stat_cb_cold_2();
LAB_0015c8d1:
    stat_cb_cold_3();
LAB_0015c8d6:
    stat_cb_cold_5();
  }
  stat_cb_cold_4();
  if (puVar4 == &unlink_req) {
    if (unlink_req.fs_type != UV_FS_UNLINK) goto LAB_0015c918;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      iVar1 = uv_fs_req_cleanup(&unlink_req);
      return iVar1;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_0015c918:
    unlink_cb_cold_2();
  }
  unlink_cb_cold_3();
  if (puVar4 == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_0015c97c;
    if (rmdir_req.result != 0) goto LAB_0015c981;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      if (rmdir_req.path[8] == '\0' && *(long *)rmdir_req.path == 0x7269645f74736574) {
        iVar1 = uv_fs_req_cleanup(&rmdir_req);
        return iVar1;
      }
      goto LAB_0015c98b;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_0015c97c:
    rmdir_cb_cold_2();
LAB_0015c981:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_0015c98b:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x10009);
  return 0;
}

Assistant:

TEST_IMPL(fs_async_dir) {
  int r;
  uv_dirent_t dent;

  /* Setup */
  unlink("test_dir/file1");
  unlink("test_dir/file2");
  rmdir("test_dir");

  loop = uv_default_loop();

  r = uv_fs_mkdir(loop, &mkdir_req, "test_dir", 0755, mkdir_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(mkdir_cb_count == 1);

  /* Create 2 files synchronously. */
  r = uv_fs_open(NULL, &open_req1, "test_dir/file1", O_WRONLY | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&open_req1);
  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_dir/file2", O_WRONLY | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&open_req1);
  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_scandir(loop, &scandir_req, "test_dir", 0, scandir_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(scandir_cb_count == 1);

  /* sync uv_fs_scandir */
  r = uv_fs_scandir(NULL, &scandir_req, "test_dir", 0, NULL);
  ASSERT(r == 2);
  ASSERT(scandir_req.result == 2);
  ASSERT(scandir_req.ptr);
  while (UV_EOF != uv_fs_scandir_next(&scandir_req, &dent)) {
    ASSERT(strcmp(dent.name, "file1") == 0 || strcmp(dent.name, "file2") == 0);
    assert_is_file_type(dent);
  }
  uv_fs_req_cleanup(&scandir_req);
  ASSERT(!scandir_req.ptr);

  r = uv_fs_stat(loop, &stat_req, "test_dir", stat_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  r = uv_fs_stat(loop, &stat_req, "test_dir/", stat_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  r = uv_fs_lstat(loop, &stat_req, "test_dir", stat_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  r = uv_fs_lstat(loop, &stat_req, "test_dir/", stat_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(stat_cb_count == 4);

  r = uv_fs_unlink(loop, &unlink_req, "test_dir/file1", unlink_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(unlink_cb_count == 1);

  r = uv_fs_unlink(loop, &unlink_req, "test_dir/file2", unlink_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(unlink_cb_count == 2);

  r = uv_fs_rmdir(loop, &rmdir_req, "test_dir", rmdir_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(rmdir_cb_count == 1);

  /* Cleanup */
  unlink("test_dir/file1");
  unlink("test_dir/file2");
  rmdir("test_dir");

  MAKE_VALGRIND_HAPPY();
  return 0;
}